

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O3

void remove_tractor_beam_from_ship(Am_Object *beam,Am_Object *ship)

{
  Am_Slot_Key AVar1;
  char cVar2;
  Am_Value *pAVar3;
  Am_Wrapper *pAVar4;
  Am_Value_List beams;
  Am_Value_List aAStack_28 [16];
  
  Am_Value_List::Am_Value_List(aAStack_28);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)ship,(ulong)TB_LIST);
  Am_Value_List::operator=(aAStack_28,pAVar3);
  Am_Value_List::Start();
  Am_Object::operator_cast_to_Am_Wrapper_(beam);
  cVar2 = Am_Value_List::Member((Am_Wrapper *)aAStack_28);
  if (cVar2 != '\0') {
    Am_Value_List::Delete(SUB81(aAStack_28,0));
  }
  AVar1 = TB_LIST;
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(aAStack_28);
  Am_Object::Set((ushort)ship,(Am_Wrapper *)(ulong)AVar1,(ulong)pAVar4);
  Am_Value_List::~Am_Value_List(aAStack_28);
  return;
}

Assistant:

void
remove_tractor_beam_from_ship(Am_Object beam, Am_Object ship)
{
  Am_Value_List beams;
  beams = ship.Get(TB_LIST);
  beams.Start();
  if (beams.Member(beam))
    beams.Delete();
  ship.Set(TB_LIST, beams);
}